

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.hpp
# Opt level: O0

critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
* __thiscall
diy::
concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
::operator[](concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
             *this,int *x)

{
  mapped_type *pmVar1;
  unique_lock<tthread::fast_mutex> *in_RDI;
  map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
  *unaff_retaddr;
  lock_guard<fast_mutex> l;
  mutex_type *in_stack_ffffffffffffffb8;
  unique_lock<tthread::fast_mutex> *__k;
  
  __k = in_RDI;
  std::unique_lock<tthread::fast_mutex>::unique_lock(in_RDI,in_stack_ffffffffffffffb8);
  pmVar1 = std::
           map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
           ::operator[](unaff_retaddr,(key_type *)__k);
  std::unique_lock<tthread::fast_mutex>::~unique_lock(in_RDI);
  return pmVar1;
}

Assistant:

U&              operator[](const T& x)  { lock_guard<fast_mutex> l(mutex_); return map_[x]; }